

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void searchtest(void)

{
  int iVar1;
  FILE *__stream;
  double *x;
  long lVar2;
  myarima_object object;
  long lVar3;
  ulong uVar4;
  double dStack_25a8;
  double temp [1200];
  
  __stream = fopen("../data/seriesB.txt","r");
  if (__stream != (FILE *)0x0) {
    uVar4 = 0;
    lVar3 = 0;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf \n",(long)temp + (uVar4 - 8));
      lVar3 = lVar3 + 1;
      uVar4 = uVar4 + 8;
    }
    x = (double *)malloc(uVar4 & 0x7fffffff8);
    for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 1) {
      x[lVar2] = temp[lVar2 + -1];
    }
    object = search_arima(x,(int)lVar3,1,0,1,1,0,0,5,0,0,"aic",0,(double *)0x0,0,0.0,0,1,0,0);
    printf("ic %g \n",object->ic);
    free(x);
    myarima_free(object);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void searchtest() {
	int i,j,p_max,q_max,P_max,Q_max,Order_max,d,D,s,stationary;
	myarima_object obj;
	double *inp,*xreg;
	int N,r = 0;
	const char *ic = "aic";
	int approximation = 0;
	double offset = 0;
	int allowdrift,allowmean,method;

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * r);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}
	d = 1;
	D = 0;
	s = 0;
	P_max = 0;
	Q_max = 0;
	p_max = 1;
	q_max = 1;
	Order_max = 5;
	stationary = 0;
	allowdrift = 0;
	allowmean = 1;
	method = 0;

	obj = search_arima(inp,N,d,D,p_max,q_max,P_max,Q_max,Order_max,stationary,s,ic,approximation, NULL,r,offset,allowdrift,allowmean,0,method);

	printf("ic %g \n",obj->ic);

	free(inp);
	free(xreg);
	myarima_free(obj);
}